

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_8::GetStateBlock(ChElementHexaCorot_8 *this,ChVectorDynamic<> *mD)

{
  void *__dest;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer psVar8;
  long lVar9;
  double *pdVar10;
  ChVectorDynamic<> *pCVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ActualDstType actualDst;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double local_78;
  double dStack_70;
  double local_68;
  ChVectorDynamic<> *local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  iVar12 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar12);
  lVar13 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar13 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar13 != 0) {
    memset((mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar13 << 3);
  }
  iVar12 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[3])(this);
  if (0 < iVar12) {
    lVar14 = 0;
    lVar15 = 0;
    uVar18 = 0;
    lVar13 = 0;
    local_60 = mD;
    do {
      pCVar11 = local_60;
      psVar8 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = *(long *)((long)&(psVar8->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar14);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(lVar9 + 0x20);
      dVar1 = *(double *)(lVar9 + 0x28);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
      auVar2 = vfmadd231sd_fma(auVar22,auVar19,auVar2);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(lVar9 + 0x30);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar2 = vfmadd231sd_fma(auVar2,auVar21,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
      auVar3 = vfmadd231sd_fma(auVar23,auVar19,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
      auVar3 = vfmadd231sd_fma(auVar3,auVar21,auVar5);
      local_50 = auVar3._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           dVar1 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
      auVar3 = vfmadd231sd_fma(auVar20,auVar19,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar21,auVar7);
      local_58 = auVar3._0_8_;
      (**(code **)(**(long **)((long)&(psVar8->
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar14) + 0x60))(&local_48);
      local_78 = auVar2._0_8_ - local_48;
      dStack_70 = local_50 - local_40;
      local_68 = local_58 - local_38;
      if ((pCVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
          + -3 < lVar15) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar10 = (pCVar11->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      __dest = (void *)((long)pdVar10 + uVar18);
      uVar16 = 3;
      if ((((ulong)__dest & 7) == 0) &&
         (uVar16 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7, 2 < uVar16)) {
        uVar16 = 3;
      }
      if (uVar16 != 0) {
        memcpy(__dest,&local_78,(ulong)(uVar16 * 8));
      }
      if (uVar16 < 3) {
        uVar17 = (ulong)(uVar16 << 3);
        memcpy((void *)((long)pdVar10 + (uVar18 & 0x7fffffff8) + uVar17),
               (void *)((long)&local_78 + uVar17),0x18 - uVar17);
      }
      lVar13 = lVar13 + 1;
      iVar12 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[3])(this);
      uVar18 = uVar18 + 0x18;
      lVar15 = lVar15 + 3;
      lVar14 = lVar14 + 0x10;
    } while (lVar13 < iVar12);
  }
  return;
}

Assistant:

void ChElementHexaCorot_8::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.setZero(this->GetNdofs());

    for (int i = 0; i < GetNnodes(); i++)
        mD.segment(i * 3, 3) = (A.transpose() * this->nodes[i]->GetPos() - nodes[i]->GetX0()).eigen();
}